

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::AppendVersion(VersionSet *this,Version *v)

{
  Version *v_local;
  VersionSet *this_local;
  
  if (v->refs_ != 0) {
    __assert_fail("v->refs_ == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                  ,0x2fa,"void leveldb::VersionSet::AppendVersion(Version *)");
  }
  if (v != this->current_) {
    if (this->current_ != (Version *)0x0) {
      Version::Unref(this->current_);
    }
    this->current_ = v;
    Version::Ref(v);
    v->prev_ = (this->dummy_versions_).prev_;
    v->next_ = &this->dummy_versions_;
    v->prev_->next_ = v;
    v->next_->prev_ = v;
    return;
  }
  __assert_fail("v != current_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set.cc"
                ,0x2fb,"void leveldb::VersionSet::AppendVersion(Version *)");
}

Assistant:

void VersionSet::AppendVersion(Version* v) {
  // Make "v" current
  assert(v->refs_ == 0);
  assert(v != current_);
  if (current_ != nullptr) {
    current_->Unref();
  }
  current_ = v;
  v->Ref();

  // Append to linked list
  v->prev_ = dummy_versions_.prev_;
  v->next_ = &dummy_versions_;
  v->prev_->next_ = v;
  v->next_->prev_ = v;
}